

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O0

bool __thiscall
ON_ComponentManifestTableIndex::AddItemAndSetManifestIndex
          (ON_ComponentManifestTableIndex *this,ON_ComponentManifestItem_PRIVATE *item)

{
  Type TVar1;
  ON_ComponentManifestItem_PRIVATE *this_00;
  Type TVar2;
  bool bVar3;
  int index;
  ON_ComponentManifestItem_PRIVATE *local_20;
  ON_ComponentManifestItem_PRIVATE *item_local;
  ON_ComponentManifestTableIndex *this_local;
  
  if (item == (ON_ComponentManifestItem_PRIVATE *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_20 = item;
    item_local = (ON_ComponentManifestItem_PRIVATE *)this;
    if (item->m_manifest_table_sn == 0) {
      TVar1 = this->m_component_type;
      TVar2 = ON_ComponentManifestItem::ComponentType(&item->super_ON_ComponentManifestItem);
      this_00 = local_20;
      if ((TVar1 == TVar2) && (this->m_component_type != Unset)) {
        if ((this->m_bIndexedComponent & 1U) == 0) {
          ON_ComponentManifestItem::SetIndex(&local_20->super_ON_ComponentManifestItem,-0x7fffffff);
        }
        else {
          index = ON_SimpleArray<const_ON_ComponentManifestItem_PRIVATE_*>::Count
                            (&this->m_item_list);
          ON_ComponentManifestItem::SetIndex(&this_00->super_ON_ComponentManifestItem,index);
          ON_SimpleArray<const_ON_ComponentManifestItem_PRIVATE_*>::Append
                    (&this->m_item_list,&local_20);
        }
        if (this->m_last_item == (ON_ComponentManifestItem_PRIVATE *)0x0) {
          this->m_first_item = local_20;
          local_20->m_prev = (ON_ComponentManifestItem_PRIVATE *)0x0;
        }
        else {
          this->m_last_item->m_next = local_20;
          local_20->m_prev = this->m_last_item;
        }
        this->m_last_item = local_20;
        local_20->m_next = (ON_ComponentManifestItem_PRIVATE *)0x0;
        local_20->m_manifest_table_sn = this->m_manifest_table_sn;
        this->m_active_and_deleted_item_count = this->m_active_and_deleted_item_count + 1;
        bVar3 = ON_ComponentManifestItem::IsDeleted(&local_20->super_ON_ComponentManifestItem);
        if (bVar3) {
          IncrementDeletedCount(this);
        }
        this_local._7_1_ = true;
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
                   ,0xc4c,"","Item has component type.");
        this_local._7_1_ = false;
      }
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
                 ,0xc46,"","item is already in a table");
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ComponentManifestTableIndex::AddItemAndSetManifestIndex(
  ON_ComponentManifestItem_PRIVATE* item
  )
{
  if ( nullptr == item )
    return false;

  if (0 != item->m_manifest_table_sn)
  {
    ON_ERROR("item is already in a table");
    return false;
  }
  
  if (m_component_type != item->ComponentType() || ON_ModelComponent::Type::Unset == m_component_type)
  {
    ON_ERROR("Item has component type.");
    return false;
  }

  if (m_bIndexedComponent)
  {
    item->SetIndex(m_item_list.Count());
    m_item_list.Append(item);
  }
  else
  {
    item->SetIndex(ON_UNSET_INT_INDEX);
  }
  
  if (nullptr == m_last_item)
  {
    m_first_item = item;
    item->m_prev = nullptr;
  }
  else
  {
    m_last_item->m_next = item;
    item->m_prev = m_last_item;
  }
  m_last_item = item;
  item->m_next = nullptr;
  
  item->m_manifest_table_sn = m_manifest_table_sn;
  m_active_and_deleted_item_count++;

  if (item->IsDeleted())
    IncrementDeletedCount();

  return true;
}